

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LargeStack.h
# Opt level: O0

StringCopyInfo * __thiscall
LargeStack<Js::StringCopyInfo>::Pop
          (StringCopyInfo *__return_storage_ptr__,LargeStack<Js::StringCopyInfo> *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Type *ppLVar4;
  undefined4 *puVar5;
  LargeStackBlock<Js::StringCopyInfo> *local_18;
  LargeStackBlock<Js::StringCopyInfo> *top;
  LargeStack<Js::StringCopyInfo> *this_local;
  
  ppLVar4 = SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::Top
                      (this->blockStack);
  local_18 = *ppLVar4;
  BVar3 = LargeStackBlock<Js::StringCopyInfo>::Empty(local_18);
  if (BVar3 != 0) {
    SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::Pop
              (this->blockStack);
    bVar2 = SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::
            Empty(&this->blockStack->
                   super_SListBase<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>
                 );
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/LargeStack.h"
                         ,0x50,"(!blockStack->Empty())","can\'t pop empty block stack");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
    ppLVar4 = SList<LargeStackBlock<Js::StringCopyInfo>_*,_Memory::ArenaAllocator,_RealCount>::Top
                        (this->blockStack);
    local_18 = *ppLVar4;
  }
  LargeStackBlock<Js::StringCopyInfo>::Pop(__return_storage_ptr__,local_18);
  return __return_storage_ptr__;
}

Assistant:

T Pop() {
        LargeStackBlock<T>* top=blockStack->Top();
        if (top->Empty()) {
            blockStack->Pop();
            AssertMsg(!blockStack->Empty(),"can't pop empty block stack");
            top=blockStack->Top();
        }
        return top->Pop();
    }